

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O2

void HistoQueueUpdateHead(HistoQueue *histo_queue,HistogramPair *pair)

{
  HistogramPair *pHVar1;
  int64_t iVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  int64_t iVar9;
  uint64_t uVar10;
  uint64_t uVar11;
  uint64_t uVar12;
  uint64_t uVar13;
  uint64_t uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  HistogramPair tmp;
  
  pHVar1 = histo_queue->queue;
  if (pair->cost_diff < pHVar1->cost_diff) {
    iVar17 = pHVar1->idx1;
    iVar18 = pHVar1->idx2;
    iVar2 = pHVar1->cost_diff;
    uVar3 = pHVar1->cost_combo;
    uVar4 = pHVar1->costs[0];
    uVar5 = pHVar1->costs[1];
    uVar6 = pHVar1->costs[2];
    uVar7 = pHVar1->costs[3];
    uVar8 = pHVar1->costs[4];
    iVar15 = pair->idx1;
    iVar16 = pair->idx2;
    iVar9 = pair->cost_diff;
    uVar10 = pair->cost_combo;
    uVar11 = pair->costs[0];
    uVar12 = pair->costs[1];
    uVar13 = pair->costs[2];
    uVar14 = pair->costs[4];
    pHVar1->costs[3] = pair->costs[3];
    pHVar1->costs[4] = uVar14;
    pHVar1->costs[1] = uVar12;
    pHVar1->costs[2] = uVar13;
    pHVar1->cost_combo = uVar10;
    pHVar1->costs[0] = uVar11;
    pHVar1->idx1 = iVar15;
    pHVar1->idx2 = iVar16;
    pHVar1->cost_diff = iVar9;
    pair->costs[3] = uVar7;
    pair->costs[4] = uVar8;
    pair->costs[1] = uVar5;
    pair->costs[2] = uVar6;
    pair->cost_combo = uVar3;
    pair->costs[0] = uVar4;
    pair->idx1 = iVar17;
    pair->idx2 = iVar18;
    pair->cost_diff = iVar2;
  }
  return;
}

Assistant:

static void HistoQueueUpdateHead(HistoQueue* const histo_queue,
                                 HistogramPair* const pair) {
  assert(pair->cost_diff < 0);
  assert(pair >= histo_queue->queue &&
         pair < (histo_queue->queue + histo_queue->size));
  assert(histo_queue->size > 0);
  if (pair->cost_diff < histo_queue->queue[0].cost_diff) {
    // Replace the best pair.
    const HistogramPair tmp = histo_queue->queue[0];
    histo_queue->queue[0] = *pair;
    *pair = tmp;
  }
}